

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_lit_errorfn(arg_lit *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  if (errorcode == 2) {
    fprintf((FILE *)fp,"%s: extraneous option ",progname);
    arg_print_option(fp,shortopts,longopts,datatype,"\n");
    return;
  }
  if (errorcode == 1) {
    fprintf((FILE *)fp,"%s: missing option ",progname);
    arg_print_option(fp,shortopts,longopts,datatype,"\n");
    fputc(10,(FILE *)fp);
    return;
  }
  return;
}

Assistant:

static void arg_lit_errorfn(
	struct arg_lit * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	switch (errorcode) {
		case EMINCOUNT:
			fprintf(fp, "%s: missing option ", progname);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			fprintf(fp, "\n");
			break;

		case EMAXCOUNT:
			fprintf(fp, "%s: extraneous option ", progname);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;
	}

	ARG_TRACE(("%s:errorfn(%p, %p, %d, %s, %s)\n", __FILE__, parent, fp,
			   errorcode, argval, progname));
}